

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-crosser.h
# Opt level: O2

function<void_()> *
capture_thread::ThreadCrosser::WrapCall
          (function<void_()> *__return_storage_ptr__,function<void_()> *call)

{
  _Manager_type p_Var1;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_18 = (_Manager_type)0x0;
  local_10 = call->_M_invoker;
  p_Var1 = (call->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_28._M_unused._0_8_ = (undefined8)*(undefined8 *)&(call->super__Function_base)._M_functor;
    local_28._8_8_ = *(undefined8 *)((long)&(call->super__Function_base)._M_functor + 8);
    (call->super__Function_base)._M_manager = (_Manager_type)0x0;
    call->_M_invoker = (_Invoker_type)0x0;
    local_18 = p_Var1;
  }
  WrapFunction<void>(__return_storage_ptr__,(function<void_()> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

static inline std::function<void()> WrapCall(std::function<void()> call) {
    return WrapFunction(std::move(call));
  }